

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

void read_children(Fl_Type *p,int paste)

{
  int iVar1;
  char *pcVar2;
  Fl_Class_Type *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *cc;
  Fl_Type *t_1;
  Fl_Type *t;
  char *c;
  Fl_Type *pFStack_10;
  int paste_local;
  Fl_Type *p_local;
  
  Fl_Type::current = p;
  c._4_4_ = paste;
  pFStack_10 = p;
LAB_001bc30d:
  do {
    t = (Fl_Type *)read_word(0);
    while( true ) {
      while( true ) {
        if (t == (Fl_Type *)0x0) {
          if ((pFStack_10 != (Fl_Type *)0x0) && (c._4_4_ == 0)) {
            read_error("Missing \'}\'");
          }
          return;
        }
        iVar1 = strcmp((char *)t,"}");
        if (iVar1 == 0) {
          if (pFStack_10 != (Fl_Type *)0x0) {
            return;
          }
          read_error("Unexpected \'}\'");
          return;
        }
        iVar1 = strcmp((char *)t,"Magic:");
        if (iVar1 == 0) {
          read_fdesign();
          return;
        }
        iVar1 = strcmp((char *)t,"version");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          read_version = strtod(pcVar2,(char **)0x0);
          if ((read_version <= 0.0) || (1.03041 < read_version)) {
            read_error("unknown version \'%s\'",pcVar2);
          }
          goto LAB_001bc30d;
        }
        if ((pFStack_10 == (Fl_Type *)0x0) &&
           (iVar1 = strcmp((char *)t,"define_in_struct"), iVar1 == 0)) {
          pFStack_10 = Fl_Type_make("class");
          pcVar2 = read_word(0);
          Fl_Type::name(pFStack_10,pcVar2);
          c._4_4_ = 1;
          Fl_Type::current = pFStack_10;
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"do_not_include_H_from_C");
        if (iVar1 == 0) {
          include_H_from_C = 0;
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"use_FL_COMMAND");
        if (iVar1 == 0) {
          use_FL_COMMAND = 1;
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_type");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_type = atoi(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_function");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_function = strdup(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_file");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_file = strdup(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_set");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_set = strdup(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_include");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_include = strdup(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_type");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_type = atoi(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"i18n_type");
        if (iVar1 == 0) {
          pcVar2 = read_word(0);
          i18n_type = atoi(pcVar2);
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"header_name");
        if (iVar1 == 0) {
          if (header_file_set == 0) {
            pcVar2 = read_word(0);
            header_file_name = strdup(pcVar2);
          }
          else {
            read_word(0);
          }
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"code_name");
        if (iVar1 == 0) {
          if (code_file_set == 0) {
            pcVar2 = read_word(0);
            code_file_name = strdup(pcVar2);
          }
          else {
            read_word(0);
          }
          goto LAB_001bc30d;
        }
        iVar1 = strcmp((char *)t,"snap");
        if (((iVar1 == 0) || (iVar1 = strcmp((char *)t,"gridx"), iVar1 == 0)) ||
           (iVar1 = strcmp((char *)t,"gridy"), iVar1 == 0)) {
          read_word(0);
          goto LAB_001bc30d;
        }
        this = (Fl_Class_Type *)Fl_Type_make((char *)t);
        if (this == (Fl_Class_Type *)0x0) {
          read_error("Unknown word \"%s\"",t);
          goto LAB_001bc30d;
        }
        pcVar2 = read_word(0);
        Fl_Type::name((Fl_Type *)this,pcVar2);
        t = (Fl_Type *)read_word(1);
        iVar1 = strcmp((char *)t,"{");
        if ((iVar1 != 0) && (iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])(), iVar1 != 0)) {
          pcVar2 = Fl_Type::name((Fl_Type *)this);
          Fl_Class_Type::prefix(this,pcVar2);
          Fl_Type::name((Fl_Type *)this,(char *)t);
          t = (Fl_Type *)read_word(1);
        }
        iVar1 = strcmp((char *)t,"{");
        if (iVar1 == 0) break;
        iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[4])();
        read_error("Missing property list for %s\n",CONCAT44(extraout_var,iVar1));
      }
      (this->super_Fl_Type).open_ = '\0';
      while ((pcVar2 = read_word(0), pcVar2 != (char *)0x0 &&
             (iVar1 = strcmp(pcVar2,"}"), iVar1 != 0))) {
        (*(this->super_Fl_Type)._vptr_Fl_Type[0xe])(this,pcVar2);
      }
      iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x16])();
      if (iVar1 == 0) goto LAB_001bc30d;
      t = (Fl_Type *)read_word(1);
      iVar1 = strcmp((char *)t,"{");
      if (iVar1 == 0) break;
      iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[4])();
      read_error("Missing child list for %s\n",CONCAT44(extraout_var_00,iVar1));
    }
    read_children((Fl_Type *)this,0);
    Fl_Type::current = pFStack_10;
  } while( true );
}

Assistant:

static void read_children(Fl_Type *p, int paste) {
  Fl_Type::current = p;
  for (;;) {
    const char *c = read_word();
  REUSE_C:
    if (!c) {
      if (p && !paste) read_error("Missing '}'");
      break;
    }

    if (!strcmp(c,"}")) {
      if (!p) read_error("Unexpected '}'");
      break;
    }

    // this is the first word in a .fd file:
    if (!strcmp(c,"Magic:")) {
      read_fdesign();
      return;
    }

    if (!strcmp(c,"version")) {
      c = read_word();
      read_version = strtod(c,0);
      if (read_version<=0 || read_version>double(FL_VERSION+0.00001))
        read_error("unknown version '%s'",c);
      continue;
    }

    // back compatibility with Vincent Penne's original class code:
    if (!p && !strcmp(c,"define_in_struct")) {
      Fl_Type *t = Fl_Type_make("class");
      t->name(read_word());
      Fl_Type::current = p = t;
      paste = 1; // stops "missing }" error
      continue;
    }

    if (!strcmp(c,"do_not_include_H_from_C")) {
      include_H_from_C=0;
      goto CONTINUE;
    }
    if (!strcmp(c,"use_FL_COMMAND")) {
      use_FL_COMMAND=1;
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type")) {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_function")) {
      i18n_function = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_file")) {
      i18n_file = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_set")) {
      i18n_set = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_include")) {
      i18n_include = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type"))
    {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type"))
    {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"header_name")) {
      if (!header_file_set) header_file_name = strdup(read_word());
      else read_word();
      goto CONTINUE;
    }

    if (!strcmp(c,"code_name")) {
      if (!code_file_set) code_file_name = strdup(read_word());
      else read_word();
      goto CONTINUE;
    }

    if (!strcmp(c, "snap") || !strcmp(c, "gridx") || !strcmp(c, "gridy")) {
      // grid settings are now global
      read_word();
      goto CONTINUE;
    }

    {Fl_Type *t = Fl_Type_make(c);
    if (!t) {
      read_error("Unknown word \"%s\"", c);
      continue;
    }
    t->name(read_word());

    c = read_word(1);
    if (strcmp(c,"{") && t->is_class()) {   // <prefix> <name>
      ((Fl_Class_Type*)t)->prefix(t->name());
      t->name(c);
      c = read_word(1);
    }

    if (strcmp(c,"{")) {
      read_error("Missing property list for %s\n",t->title());
      goto REUSE_C;
    }

    t->open_ = 0;
    for (;;) {
      const char *cc = read_word();
      if (!cc || !strcmp(cc,"}")) break;
      t->read_property(cc);
    }

    if (!t->is_parent()) continue;
    c = read_word(1);
    if (strcmp(c,"{")) {
      read_error("Missing child list for %s\n",t->title());
      goto REUSE_C;
    }
    read_children(t, 0);}
    Fl_Type::current = p;
  CONTINUE:;
  }
}